

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PositionZ.cpp
# Opt level: O2

void __thiscall OpenMD::PositionZ::process(PositionZ *this)

{
  SelectionManager *this_00;
  char cVar1;
  SimInfo *info;
  Snapshot *pSVar2;
  int iVar3;
  int iVar4;
  StuntDouble *pSVar5;
  mapped_type_conflict *pmVar6;
  pointer pdVar7;
  ulong uVar8;
  double dVar9;
  int ii;
  int binNo;
  Vector3d pos;
  Vector3d pos_2;
  Mat3x3d hmat;
  DumpReader reader;
  int local_1334;
  int local_1330;
  int local_132c;
  SelectionEvaluator *local_1328;
  vector<double,_std::allocator<double>_> *local_1320;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_1318;
  Vector3d local_12e8;
  Mat3x3d local_12d0;
  DumpReader local_1288;
  
  info = (this->super_StaticAnalyser).info_;
  cVar1 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,info,&(this->super_StaticAnalyser).dumpFilename_);
  iVar3 = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = iVar3 / (this->super_StaticAnalyser).step_;
  local_1320 = &this->zBox_;
  local_1328 = &this->evaluator_;
  this_00 = &this->seleMan_;
  iVar4 = 0;
  while (iVar4 < iVar3) {
    local_1330 = iVar4;
    DumpReader::readFrame(&local_1288,iVar4);
    pSVar2 = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
    this->currentSnapshot_ = pSVar2;
    Snapshot::getHmat(&local_12d0,pSVar2);
    std::vector<double,_std::allocator<double>_>::push_back
              (local_1320,
               (value_type_conflict2 *)
               ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_ + (ulong)(uint)this->axis_ * 0x20));
    dVar9 = *(double *)
             ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
             + (ulong)(uint)this->axis_ * 0x20);
    if ((this->evaluator_).isDynamic_ == true) {
      SelectionEvaluator::evaluate((SelectionSet *)&local_1318,local_1328);
      SelectionManager::setSelectionSet(this_00,(SelectionSet *)&local_1318);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_1318)
      ;
    }
    pSVar5 = SelectionManager::beginSelected(this_00,&local_1334);
    while (pSVar5 != (StuntDouble *)0x0) {
      StuntDouble::getPos((Vector3d *)&local_1318,pSVar5);
      if (cVar1 != '\0') {
        Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_1318);
      }
      StuntDouble::setPos(pSVar5,(Vector3d *)&local_1318);
      pSVar5 = SelectionManager::nextSelected(this_00,&local_1334);
    }
    pSVar5 = SelectionManager::beginSelected(this_00,&local_1334);
    while (pSVar5 != (StuntDouble *)0x0) {
      StuntDouble::getPos((Vector3d *)&local_1318,pSVar5);
      iVar4 = (int)(((*(double *)(&local_1318._M_impl.field_0x0 + (ulong)(uint)this->axis_ * 8) +
                     dVar9 * 0.5) * (double)(this->super_StaticAnalyser).nBins_) /
                   *(double *)
                    ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                           .data_ + (ulong)(uint)this->axis_ * 0x20));
      pdVar7 = (this->sliceSDCount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7[iVar4] = pdVar7[iVar4] + 1.0;
      pSVar5 = SelectionManager::nextSelected(this_00,&local_1334);
    }
    iVar4 = local_1330 + (this->super_StaticAnalyser).step_;
  }
  for (iVar4 = 0; iVar4 < iVar3; iVar4 = iVar4 + (this->super_StaticAnalyser).step_) {
    local_1318._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1318._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1318._M_impl.super__Rb_tree_header._M_header;
    local_1318._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1318._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1318._M_impl.super__Rb_tree_header._M_header._M_left;
    DumpReader::readFrame(&local_1288,iVar4);
    pSVar2 = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
    this->currentSnapshot_ = pSVar2;
    Snapshot::getHmat(&local_12d0,pSVar2);
    dVar9 = *(double *)
             ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
             + (ulong)(uint)this->axis_ * 0x20);
    pSVar5 = SelectionManager::beginSelected(this_00,&local_1334);
    while (pSVar5 != (StuntDouble *)0x0) {
      StuntDouble::getPos(&local_12e8,pSVar5);
      local_132c = (int)(((local_12e8.super_Vector<double,_3U>.data_[(uint)this->axis_] +
                          dVar9 * 0.5) * (double)(this->super_StaticAnalyser).nBins_) /
                        *(double *)
                         ((long)local_12d0.super_SquareMatrix<double,_3>.
                                super_RectMatrix<double,_3U,_3U>.data_ +
                         (ulong)(uint)this->axis_ * 0x20));
      pmVar6 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_1318,&local_132c);
      *pmVar6 = *pmVar6 + 1.0;
      pSVar5 = SelectionManager::nextSelected(this_00,&local_1334);
    }
    pdVar7 = (this->flucSliceSDCount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar8 = 0;
        uVar8 < (ulong)((long)(this->flucSliceSDCount_).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pdVar7 >> 3);
        uVar8 = (ulong)((int)uVar8 + 1)) {
      local_12e8.super_Vector<double,_3U>.data_[0]._0_4_ = (int)uVar8;
      pmVar6 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)&local_1318,(key_type *)&local_12e8);
      dVar9 = *pmVar6 - (this->sliceSDCount_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar8] / (double)this->nProcessed_;
      pdVar7 = (this->flucSliceSDCount_).super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start;
      pdVar7[uVar8] = dVar9 * dVar9 + pdVar7[uVar8];
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree(&local_1318);
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void PositionZ::process() {
    StuntDouble* sd;
    int ii;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      Mat3x3d hmat = currentSnapshot_->getHmat();
      zBox_.push_back(hmat(axis_, axis_));

      RealType halfBoxZ_ = hmat(axis_, axis_) / 2.0;

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // wrap the stuntdoubles into a cell
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(pos);
        sd->setPos(pos);
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        // shift molecules by half a box to have bins start at 0
        int binNo = int(nBins_ * (halfBoxZ_ + pos[axis_]) / hmat(axis_, axis_));
        sliceSDCount_[binNo]++;
      }

      // loop over the slices to calculate the charge
    }

    for (int istep = 0; istep < nFrames; istep += step_) {
      std::map<int, RealType> countInBin;

      reader.readFrame(istep);
      currentSnapshot_   = info_->getSnapshotManager()->getCurrentSnapshot();
      Mat3x3d hmat       = currentSnapshot_->getHmat();
      RealType halfBoxZ_ = hmat(axis_, axis_) / 2.0;

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        // shift molecules by half a box to have bins start at 0
        int binNo = int(nBins_ * (halfBoxZ_ + pos[axis_]) / hmat(axis_, axis_));
        countInBin[binNo]++;
      }

      // loop over the slices to calculate the charge

      for (unsigned int index = 0; index < flucSliceSDCount_.size(); ++index) {
        RealType flucCount =
            (countInBin[index] - (sliceSDCount_[index] / nProcessed_));
        flucSliceSDCount_[index] += flucCount * flucCount;
      }
    }

    writePositionZ();
  }